

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall ChatServer::connectionCreated(ChatServer *this,Stream *stream)

{
  ostream *poVar1;
  long lVar2;
  mapped_type *this_00;
  undefined1 local_68 [8];
  string nick;
  string local_38;
  Stream *local_18;
  Stream *stream_local;
  ChatServer *this_local;
  
  local_18 = stream;
  stream_local = (Stream *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"+ Incoming connection from ");
  Dashel::Stream::getTargetName_abi_cxx11_(&local_38,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  readLine_abi_cxx11_((string *)local_68,local_18);
  lVar2 = std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)local_68,lVar2 - 1);
  this_00 = std::
            map<Dashel::Stream_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->nicks,&local_18);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"+ User ");
  poVar1 = std::operator<<(poVar1,(string *)local_68);
  poVar1 = std::operator<<(poVar1," is connected.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void connectionCreated(Stream* stream)
	{
		cout << "+ Incoming connection from " << stream->getTargetName() << " (" << stream << ")" << endl;
		string nick = readLine(stream);
		nick.erase(nick.length() - 1);
		nicks[stream] = nick;
		cout << "+ User " << nick << " is connected." << endl;
	}